

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

void prof_bandage(CHAR_DATA *ch,char *argument)

{
  string_view fmt;
  bool bVar1;
  int iVar2;
  CHAR_DATA *pCVar3;
  AFFECT_DATA *pAVar4;
  double *pdVar5;
  float *pfVar6;
  char *in_RSI;
  char_data *in_RDI;
  float chance;
  bool in_stack_00000013;
  int in_stack_00000014;
  char *in_stack_00000018;
  CHAR_DATA *in_stack_00000020;
  float hadd;
  AFFECT_DATA *baf;
  CHAR_DATA *victim;
  char *in_stack_000011b0;
  CHAR_DATA *in_stack_000011b8;
  undefined4 in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  char *profname;
  CProficiencies *in_stack_ffffffffffffffc0;
  float local_34;
  CLogger *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  CHAR_DATA *pCVar7;
  char *in_stack_ffffffffffffffe0;
  
  if (in_RDI == (char_data *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffc0,
               (char *)in_stack_ffffffffffffffb8);
    fmt._M_str = in_stack_ffffffffffffffe0;
    fmt._M_len = in_stack_ffffffffffffffd8;
    CLogger::Debug<>(in_stack_ffffffffffffffd0,fmt);
  }
  else {
    if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
      pCVar3 = get_char_room(in_stack_000011b8,in_stack_000011b0);
    }
    else {
      pCVar3 = get_char_room(in_stack_000011b8,in_stack_000011b0);
    }
    if (pCVar3 == (CHAR_DATA *)0x0) {
      send_to_char((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else {
      pCVar7 = pCVar3;
      pAVar4 = affect_find(pCVar3->affected,(int)gsn_bleeding);
      if (pAVar4 == (AFFECT_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      else {
        bVar1 = is_affected_prof(in_stack_ffffffffffffffb8,
                                 (char *)CONCAT44(in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0));
        if (bVar1) {
          send_to_char((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        }
        else {
          add_prof_affect(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000013);
          if (pCVar7 == in_RDI) {
            send_to_char((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
            act((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),pCVar3,0);
          }
          else {
            act((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),pCVar3,0);
            act((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),pCVar3,0);
            act((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),pCVar3,0);
          }
          char_data::Profs(in_RDI);
          iVar2 = CProficiencies::GetProf
                            (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
          pCVar3 = (CHAR_DATA *)((double)iVar2 * 0.4);
          profname = (char *)0x3ff0000000000000;
          pdVar5 = std::max<double>((double *)&stack0xffffffffffffffc0,
                                    (double *)&stack0xffffffffffffffb8);
          local_34 = (float)(*pdVar5 * (double)(int)pCVar7->level + (double)pCVar7->hit);
          chance = (float)(int)pCVar7->max_hit;
          pfVar6 = std::min<float>((float *)&stack0xffffffffffffffb4,&local_34);
          pCVar7->hit = (int)*pfVar6;
          char_data::Profs(in_RDI);
          CProficiencies::CheckImprove((CProficiencies *)pCVar3,profname,(int)chance);
          WAIT_STATE(pCVar3,(int)((ulong)profname >> 0x20));
        }
      }
    }
  }
  return;
}

Assistant:

void prof_bandage(CHAR_DATA *ch, char *argument)
{
	if (ch == nullptr)
	{
		RS.Logger.Debug("prof_bandage: ch is nullptr");
		return;
	}

	auto victim = argument == nullptr || argument[0] == '\0'
		? get_char_room(ch, "self")
		: get_char_room(ch, argument);

	if (!victim)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	auto baf = affect_find(victim->affected, gsn_bleeding);
	if (!baf)
	{
		send_to_char("You can only bandage wounds that are bleeding.\n\r", ch);
		return;
	}

	if (is_affected_prof(ch, "bandage"))
	{
		send_to_char("That wound has been bandaged too recently.\n\r", ch);
		return;
	}

	//if(baf->level)
	//	baf->level /= 2;

	add_prof_affect(ch, "bandage", 2, false);

	if (victim == ch)
	{
		send_to_char("You bandage your wounds, staunching the worst of the bleeding.\n\r", ch);
		act("$n bandages $s wounds, staunching the worst of $s bleeding.", ch, 0, 0, TO_ROOM);
	}
	else
	{
		act("You bandage $N's wounds, staunching the worst of $S bleeding.", ch, 0, victim, TO_CHAR);
		act("$n bandages your wounds, staunching the worst of the bleeding.", ch, 0, victim, TO_VICT);
		act("$n bandages $N's wounds, staunching the worst of $S bleeding.", ch, 0, victim, TO_NOTVICT);
	}

	float hadd = (std::max(ch->Profs()->GetProf("bandaging") * 0.4, (double)1) * victim->level) + victim->hit;
	victim->hit = std::min((float)victim->max_hit, hadd);
	ch->Profs()->CheckImprove("bandaging", 1000);

	WAIT_STATE(ch, PULSE_VIOLENCE);
}